

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O0

ostream * operator<<(ostream *output,sax_event_t *event)

{
  bool bVar1;
  reference pbVar2;
  ostream *poVar3;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_88;
  const_iterator it_1;
  undefined1 local_78 [7];
  bool first_1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  const_iterator it;
  bool first;
  string local_38;
  sax_event_t *local_18;
  sax_event_t *event_local;
  ostream *output_local;
  
  local_18 = event;
  event_local = (sax_event_t *)output;
  switch(event->type) {
  case invalid_type:
    poVar3 = std::operator<<(output,"{");
    poVar3 = std::operator<<(poVar3,"invalid");
    std::operator<<(poVar3,"}");
    break;
  case start_document:
    poVar3 = std::operator<<(output,"{");
    poVar3 = std::operator<<(poVar3,"start_document");
    std::operator<<(poVar3,"}");
    break;
  case finish_document:
    poVar3 = std::operator<<(output,"{");
    poVar3 = std::operator<<(poVar3,"finish_document");
    std::operator<<(poVar3,"}");
    break;
  case comment:
    poVar3 = std::operator<<(output,"{");
    poVar3 = std::operator<<(poVar3,"comment");
    poVar3 = std::operator<<(poVar3,", \'");
    escape_string(&local_38,&local_18->string_data);
    poVar3 = std::operator<<(poVar3,(string *)&local_38);
    std::operator<<(poVar3,"\'}");
    std::__cxx11::string::~string((string *)&local_38);
    break;
  case table:
    poVar3 = std::operator<<(output,"{");
    poVar3 = std::operator<<(poVar3,"table");
    std::operator<<(poVar3,", {");
    it._M_current._3_1_ = 1;
    local_50._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&local_18->keys);
    while( true ) {
      local_58._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&local_18->keys);
      bVar1 = __gnu_cxx::operator!=(&local_50,&local_58);
      if (!bVar1) break;
      if ((it._M_current._3_1_ & 1) == 0) {
        std::operator<<((ostream *)event_local,", ");
      }
      else {
        it._M_current._3_1_ = 0;
      }
      poVar3 = std::operator<<((ostream *)event_local,"\'");
      pbVar2 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_50);
      escape_string((string *)local_78,pbVar2);
      poVar3 = std::operator<<(poVar3,(string *)local_78);
      std::operator<<(poVar3,"\'");
      std::__cxx11::string::~string((string *)local_78);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_50);
    }
    std::operator<<((ostream *)event_local,"}}");
    break;
  case table_array_item:
    poVar3 = std::operator<<(output,"{");
    poVar3 = std::operator<<(poVar3,"table_array_item");
    std::operator<<(poVar3,", {");
    it_1._M_current._7_1_ = 1;
    local_88._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&local_18->keys);
    while( true ) {
      local_90._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&local_18->keys);
      bVar1 = __gnu_cxx::operator!=(&local_88,&local_90);
      if (!bVar1) break;
      if ((it_1._M_current._7_1_ & 1) == 0) {
        std::operator<<((ostream *)event_local,", ");
      }
      else {
        it_1._M_current._7_1_ = 0;
      }
      poVar3 = std::operator<<((ostream *)event_local,"\'");
      pbVar2 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_88);
      escape_string(&local_b0,pbVar2);
      poVar3 = std::operator<<(poVar3,(string *)&local_b0);
      std::operator<<(poVar3,"\'");
      std::__cxx11::string::~string((string *)&local_b0);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_88);
    }
    std::operator<<((ostream *)event_local,"}}");
    break;
  case key:
    poVar3 = std::operator<<(output,"{");
    poVar3 = std::operator<<(poVar3,"key");
    poVar3 = std::operator<<(poVar3,", \'");
    escape_string(&local_d0,&local_18->string_data);
    poVar3 = std::operator<<(poVar3,(string *)&local_d0);
    std::operator<<(poVar3,"\'}");
    std::__cxx11::string::~string((string *)&local_d0);
    break;
  case start_array:
    poVar3 = std::operator<<(output,"{");
    poVar3 = std::operator<<(poVar3,"start_array");
    std::operator<<(poVar3,"}");
    break;
  case finish_array:
    poVar3 = std::operator<<(output,"{");
    poVar3 = std::operator<<(poVar3,"finish_array");
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_18->int_data);
    std::operator<<(poVar3,"}");
    break;
  case start_inline_table:
    poVar3 = std::operator<<(output,"{");
    poVar3 = std::operator<<(poVar3,"start_inline_table");
    std::operator<<(poVar3,"}");
    break;
  case finish_inline_table:
    poVar3 = std::operator<<(output,"{");
    poVar3 = std::operator<<(poVar3,"finish_inline_table");
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_18->int_data);
    std::operator<<(poVar3,"}");
    break;
  case boolean:
    poVar3 = std::operator<<(output,"{");
    poVar3 = std::operator<<(poVar3,"boolean");
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(bool)(local_18->bool_data & 1));
    std::operator<<(poVar3,"}");
    break;
  case string:
    poVar3 = std::operator<<(output,"{");
    poVar3 = std::operator<<(poVar3,"string");
    poVar3 = std::operator<<(poVar3,", \'");
    escape_string(&local_f0,&local_18->string_data);
    poVar3 = std::operator<<(poVar3,(string *)&local_f0);
    std::operator<<(poVar3,"\'}");
    std::__cxx11::string::~string((string *)&local_f0);
    break;
  case datetime:
    poVar3 = std::operator<<(output,"{");
    poVar3 = std::operator<<(poVar3,"datetime");
    poVar3 = std::operator<<(poVar3,", \'");
    escape_string(&local_110,&local_18->string_data);
    poVar3 = std::operator<<(poVar3,(string *)&local_110);
    std::operator<<(poVar3,"\'}");
    std::__cxx11::string::~string((string *)&local_110);
    break;
  case integer:
    poVar3 = std::operator<<(output,"{");
    poVar3 = std::operator<<(poVar3,"integer");
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_18->int_data);
    std::operator<<(poVar3,"}");
    break;
  case floating_point:
    poVar3 = std::operator<<(output,"{");
    poVar3 = std::operator<<(poVar3,"floating_point");
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_18->float_data);
    std::operator<<(poVar3,"}");
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/andrusha97[P]loltoml/tests/common.hpp"
                  ,0xdd,"std::ostream &operator<<(std::ostream &, const sax_event_t &)");
  }
  return (ostream *)event_local;
}

Assistant:

inline std::ostream &operator<<(std::ostream &output, const sax_event_t &event) {
    switch(event.type) {
    case sax_event_t::invalid_type: {
        output << "{" << "invalid" << "}";
    } break;
    case sax_event_t::start_document: {
        output << "{" << "start_document" << "}";
    } break;
    case sax_event_t::finish_document: {
        output << "{" << "finish_document" << "}";
    } break;
    case sax_event_t::comment: {
        output << "{" << "comment" << ", '" << escape_string(event.string_data) << "'}";
    } break;
    case sax_event_t::table: {
        output << "{" << "table" << ", {";

        bool first = true;
        for (auto it = event.keys.begin(); it != event.keys.end(); ++it) {
            if (!first) {
                output << ", ";
            } else {
                first = false;
            }

            output << "'" << escape_string(*it) << "'";
        }

        output << "}}";
    } break;
    case sax_event_t::table_array_item: {
        output << "{" << "table_array_item" << ", {";

        bool first = true;
        for (auto it = event.keys.begin(); it != event.keys.end(); ++it) {
            if (!first) {
                output << ", ";
            } else {
                first = false;
            }

            output << "'" << escape_string(*it) << "'";
        }

        output << "}}";
    } break;
    case sax_event_t::key: {
        output << "{" << "key" << ", '" << escape_string(event.string_data) << "'}";
    } break;
    case sax_event_t::start_array: {
        output << "{" << "start_array" << "}";
    } break;
    case sax_event_t::finish_array: {
        output << "{" << "finish_array" << ", " << event.int_data << "}";
    } break;
    case sax_event_t::start_inline_table: {
        output << "{" << "start_inline_table" << "}";
    } break;
    case sax_event_t::finish_inline_table: {
        output << "{" << "finish_inline_table" << ", " << event.int_data << "}";
    } break;
    case sax_event_t::boolean: {
        output << "{" << "boolean" << ", " << event.bool_data << "}";
    } break;
    case sax_event_t::string: {
        output << "{" << "string" << ", '" << escape_string(event.string_data) << "'}";
    } break;
    case sax_event_t::datetime: {
        output << "{" << "datetime" << ", '" << escape_string(event.string_data) << "'}";
    } break;
    case sax_event_t::integer: {
        output << "{" << "integer" << ", " << event.int_data << "}";
    } break;
    case sax_event_t::floating_point: {
        output << "{" << "floating_point" << ", " << event.float_data << "}";
    } break;
    default: assert(false);
    }

    return output;
}